

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O1

void __thiscall
sptk::world::Harvest
          (world *this,double *x,int x_length,int fs,HarvestOption *option,
          double *temporal_positions,double *f0)

{
  int iVar1;
  int iVar2;
  double *temporal_positions_00;
  double *f0_00;
  undefined4 in_register_0000000c;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double in_XMM3_Qa;
  
  pdVar3 = (double *)CONCAT44(in_register_0000000c,fs);
  dVar7 = (double)x_length;
  iVar1 = matlab_round(dVar7 / 8000.0);
  iVar6 = (int)x;
  if ((pdVar3[2] == 1.0) && (!NAN(pdVar3[2]))) {
    anon_unknown_5::HarvestGeneralBody
              ((double *)this,iVar6,x_length,iVar1,*pdVar3,pdVar3[1],pdVar3[3],(int)option,
               in_XMM3_Qa,temporal_positions,f0);
    return;
  }
  dVar7 = ((double)iVar6 * 1000.0) / dVar7;
  iVar5 = (int)dVar7;
  uVar4 = 0xffffffffffffffff;
  if (-2 < iVar5) {
    uVar4 = (long)iVar5 * 8 + 8;
  }
  temporal_positions_00 = (double *)operator_new__(uVar4);
  f0_00 = (double *)operator_new__(uVar4);
  anon_unknown_5::HarvestGeneralBody
            ((double *)this,iVar6,x_length,iVar1,*pdVar3,pdVar3[1],pdVar3[3],(int)f0_00,in_XMM3_Qa,
             temporal_positions_00,f0_00);
  iVar1 = (int)(dVar7 / pdVar3[2]);
  if (-1 < iVar1) {
    uVar4 = 0;
    do {
      dVar7 = ((double)(int)uVar4 * pdVar3[2]) / 1000.0;
      (&option->f0_floor)[uVar4] = dVar7;
      iVar2 = matlab_round(dVar7 * 1000.0);
      iVar6 = iVar5;
      if (iVar2 <= iVar5) {
        iVar6 = iVar2;
      }
      temporal_positions[uVar4] = temporal_positions_00[iVar6];
      uVar4 = uVar4 + 1;
    } while (iVar1 + 1 != uVar4);
  }
  operator_delete__(temporal_positions_00);
  operator_delete__(f0_00);
  return;
}

Assistant:

void Harvest(const double *x, int x_length, int fs,
    const HarvestOption *option, double *temporal_positions, double *f0) {
  // Several parameters will be controllable for debug.
  double target_fs = 8000.0;
  int dimension_ratio = matlab_round(fs / target_fs);
  double channels_in_octave = 40;

  if (option->frame_period == 1.0) {
    HarvestGeneralBody(x, x_length, fs, 1, option->f0_floor,
        option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
        temporal_positions, f0);
#else
        option->allowed_range, temporal_positions, f0);
#endif
    return;
  }

  int basic_frame_period = 1;
  int basic_f0_length =
    GetSamplesForHarvest(fs, x_length, basic_frame_period);
  double *basic_f0 = new double[basic_f0_length];
  double *basic_temporal_positions = new double[basic_f0_length];
  HarvestGeneralBody(x, x_length, fs, basic_frame_period, option->f0_floor,
      option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
      basic_temporal_positions, basic_f0);
#else
      option->allowed_range, basic_temporal_positions, basic_f0);
#endif

  int f0_length = GetSamplesForHarvest(fs, x_length, option->frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * option->frame_period / 1000.0;
    f0[i] = basic_f0[MyMinInt(basic_f0_length - 1,
      matlab_round(temporal_positions[i] * 1000.0))];
  }

  delete[] basic_f0;
  delete[] basic_temporal_positions;
}